

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_affinity_invalid_mask(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_buf_t *buf;
  uv_process_options_t *unaff_RBX;
  undefined1 *nread;
  uv_stream_t *stream;
  char newmask [1];
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_820 [24];
  uv_buf_t uStack_808;
  uv_fs_t uStack_7f0;
  uv_pipe_t uStack_630;
  uv_stdio_container_t uStack_548;
  undefined4 uStack_538;
  undefined4 uStack_528;
  uv_loop_t *puStack_510;
  long lStack_4d8;
  uint uStack_4d0;
  int iStack_4cc;
  uv_buf_t uStack_4c8;
  char acStack_4b8 [16];
  uv_stdio_container_t uStack_4a8;
  uv_write_t uStack_490;
  uv_write_t uStack_3c8;
  uv_stream_t uStack_300;
  uv_fs_t uStack_218;
  uv_loop_t *puStack_58;
  char local_19;
  long local_18;
  long local_10;
  
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001bf101:
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001bf106:
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    init_process_options("",exit_cb);
    options.cpumask = &local_19;
    local_19 = '\0';
    options.cpumask_size = 0;
    unaff_RBX = &options;
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    if (iVar1 != -0x16) goto LAB_001bf101;
    if (exit_cb_called != 0) goto LAB_001bf106;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    local_10 = 0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    local_18 = (long)iVar1;
    if (local_10 == local_18) {
      uv_library_shutdown();
      return 0;
    }
  }
  run_test_spawn_affinity_invalid_mask_cold_4();
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001bf286;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 0) goto LAB_001bf293;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001bf2a0;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 1) goto LAB_001bf2ad;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_auto_unref_cold_1();
LAB_001bf286:
    run_test_spawn_auto_unref_cold_2();
LAB_001bf293:
    run_test_spawn_auto_unref_cold_3();
LAB_001bf2a0:
    run_test_spawn_auto_unref_cold_4();
LAB_001bf2ad:
    run_test_spawn_auto_unref_cold_5();
  }
  run_test_spawn_auto_unref_cold_6();
  builtin_strncpy(acStack_4b8,"/dev/null",10);
  puStack_58 = (uv_loop_t *)unaff_RBX;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_218,acStack_4b8,2,0,(uv_fs_cb)0x0);
  uStack_300.data = (void *)(long)iVar1;
  uStack_3c8.data = (void *)0x0;
  if (uStack_300.data == (void *)0x0) {
    unaff_RBX = (uv_process_options_t *)(ulong)(uint)uStack_218.result;
    uStack_4d0 = (uint)uStack_218.result;
    init_process_options("spawn_helper8",exit_cb);
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)&uStack_300,0);
    uStack_3c8.data = (void *)(long)iVar1;
    uStack_490.data = (void *)0x0;
    if (uStack_3c8.data != (void *)0x0) goto LAB_001bf5e0;
    options.stdio = &uStack_4a8;
    uStack_4a8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_4a8.data.stream = &uStack_300;
    iStack_4cc = dup((uint)uStack_218.result);
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    uStack_3c8.data = (void *)(long)iVar1;
    uStack_490.data = (void *)0x0;
    if (uStack_3c8.data != (void *)0x0) goto LAB_001bf5f2;
    uStack_4c8 = uv_buf_init((char *)&uStack_4d0,4);
    iVar1 = uv_write(&uStack_3c8,&uStack_300,&uStack_4c8,1,write_null_cb);
    uStack_490.data = (void *)(long)iVar1;
    if (uStack_490.data != (void *)0x0) goto LAB_001bf604;
    uStack_4c8 = uv_buf_init((char *)&iStack_4cc,4);
    iVar1 = uv_write(&uStack_490,&uStack_300,&uStack_4c8,1,write_cb);
    lStack_4d8 = 0;
    if (iVar1 != 0) goto LAB_001bf613;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_4d8 = 0;
    if (iVar1 != 0) goto LAB_001bf622;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_218,uStack_4d0,(uv_fs_cb)0x0);
    lStack_4d8 = 0;
    if (iVar1 != 0) goto LAB_001bf631;
    lStack_4d8 = (long)exit_cb_called;
    if (lStack_4d8 != 1) goto LAB_001bf640;
    lStack_4d8 = (long)close_cb_called;
    if (lStack_4d8 != 2) goto LAB_001bf64f;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    lStack_4d8 = (long)iVar1;
    if (lStack_4d8 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001bf5e0:
    run_test_spawn_fs_open_cold_2();
LAB_001bf5f2:
    run_test_spawn_fs_open_cold_3();
LAB_001bf604:
    run_test_spawn_fs_open_cold_4();
LAB_001bf613:
    run_test_spawn_fs_open_cold_5();
LAB_001bf622:
    run_test_spawn_fs_open_cold_6();
LAB_001bf631:
    run_test_spawn_fs_open_cold_7();
LAB_001bf640:
    run_test_spawn_fs_open_cold_8();
LAB_001bf64f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_4d8;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_510 = (uv_loop_t *)unaff_RBX;
  uStack_808 = uv_buf_init("",1);
  iVar1 = uv_pipe((uv_os_fd_t *)(auStack_820 + 0x10),0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_548;
    uStack_548.flags = UV_INHERIT_FD;
    uStack_548.data.file = auStack_820._16_4_;
    uStack_538 = 0;
    uStack_528 = 0;
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    uStack_7f0.data = (void *)(long)iVar1;
    uStack_630.data = (void *)0x0;
    if ((uv_handle_t *)uStack_7f0.data != (uv_handle_t *)0x0) goto LAB_001bfb1b;
    uv_unref((uv_handle_t *)&process);
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&uStack_630,0);
    uStack_7f0.data = (void *)(long)iVar1;
    auStack_820._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_7f0.data != (uv_handle_t *)0x0) goto LAB_001bfb2d;
    iVar1 = uv_pipe_open(&uStack_630,auStack_820._16_4_);
    uStack_7f0.data = (void *)(long)iVar1;
    auStack_820._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_7f0.data != (uv_handle_t *)0x0) goto LAB_001bfb3c;
    auStack_820._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start((uv_stream_t *)&uStack_630,on_alloc,on_read_once);
    uStack_7f0.data = (void *)(long)iVar1;
    auStack_820._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_7f0.data != (uv_handle_t *)0x0) goto LAB_001bfb4b;
    auStack_820._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&uStack_7f0,auStack_820._20_4_,&uStack_808,1,-1,
                        (uv_fs_cb)0x0);
    auStack_820._8_8_ = SEXT48(iVar1);
    if (auStack_820._0_8_ != auStack_820._8_8_) goto LAB_001bfb5a;
    auStack_820._0_8_ = (uv_loop_t *)0x1;
    auStack_820._8_8_ = uStack_7f0.result;
    if ((uv_loop_t *)uStack_7f0.result != (uv_loop_t *)0x1) goto LAB_001bfb69;
    uv_fs_req_cleanup(&uStack_7f0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    auStack_820._0_8_ = SEXT48(iVar1);
    auStack_820._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_820._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb78;
    auStack_820._0_8_ = (uv_loop_t *)0x1;
    auStack_820._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_820._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb87;
    uv_close((uv_handle_t *)&uStack_630,close_cb);
    auStack_820._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&uStack_7f0,auStack_820._20_4_,&uStack_808,1,-1,
                        (uv_fs_cb)0x0);
    auStack_820._8_8_ = SEXT48(iVar1);
    if (auStack_820._0_8_ != auStack_820._8_8_) goto LAB_001bfb96;
    auStack_820._0_8_ = (uv_loop_t *)0x1;
    auStack_820._8_8_ = uStack_7f0.result;
    if ((uv_loop_t *)uStack_7f0.result != (uv_loop_t *)0x1) goto LAB_001bfba5;
    uv_fs_req_cleanup(&uStack_7f0);
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    auStack_820._0_8_ = SEXT48(iVar1);
    auStack_820._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_820._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbb4;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_820._0_8_ = SEXT48(iVar1);
    auStack_820._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_820._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbc3;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 1) {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_ONCE);
      auStack_820._0_8_ = SEXT48(iVar1);
      auStack_820._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_820._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfc0e;
    }
    auStack_820._0_8_ = (uv_loop_t *)0x1;
    auStack_820._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_820._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbd2;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_820._0_8_ = SEXT48(iVar1);
    auStack_820._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_820._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe1;
    iVar1 = close(auStack_820._20_4_);
    auStack_820._0_8_ = SEXT48(iVar1);
    auStack_820._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_820._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbf0;
    auStack_820._20_4_ = -1;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_820._0_8_ = (uv_loop_t *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    auStack_820._8_8_ = SEXT48(iVar1);
    if (auStack_820._0_8_ == auStack_820._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfb1b:
    run_test_closed_fd_events_cold_2();
LAB_001bfb2d:
    run_test_closed_fd_events_cold_3();
LAB_001bfb3c:
    run_test_closed_fd_events_cold_4();
LAB_001bfb4b:
    run_test_closed_fd_events_cold_5();
LAB_001bfb5a:
    run_test_closed_fd_events_cold_6();
LAB_001bfb69:
    run_test_closed_fd_events_cold_7();
LAB_001bfb78:
    run_test_closed_fd_events_cold_8();
LAB_001bfb87:
    run_test_closed_fd_events_cold_9();
LAB_001bfb96:
    run_test_closed_fd_events_cold_10();
LAB_001bfba5:
    run_test_closed_fd_events_cold_11();
LAB_001bfbb4:
    run_test_closed_fd_events_cold_12();
LAB_001bfbc3:
    run_test_closed_fd_events_cold_13();
LAB_001bfbd2:
    run_test_closed_fd_events_cold_15();
LAB_001bfbe1:
    run_test_closed_fd_events_cold_16();
LAB_001bfbf0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfc0e:
  stream = (uv_stream_t *)auStack_820;
  nread = auStack_820 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_affinity_invalid_mask) {
#if defined(NO_CPU_AFFINITY)
  RETURN_SKIP(NO_CPU_AFFINITY);
#else
  int r;
  char newmask[1];
  int cpumask_size;

  cpumask_size = uv_cpumask_size();
  ASSERT(cpumask_size > 0);

  init_process_options("", exit_cb);

  /* provide a mask that is too small */
  newmask[0] = 0;
  options.cpumask_size = 0;
  options.cpumask = newmask;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_EINVAL);

  ASSERT(exit_cb_called == 0);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}